

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall
QGraphicsScenePrivate::ungrabKeyboard
          (QGraphicsScenePrivate *this,QGraphicsItem *item,bool itemIsDying)

{
  ulong uVar1;
  qsizetype *pqVar2;
  long lVar3;
  QGraphicsItem **ppQVar4;
  QGraphicsItem *item_00;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (this->keyboardGrabberItems).d.size;
  if (0 < lVar3) {
    ppQVar4 = (this->keyboardGrabberItems).d.ptr;
    lVar6 = (lVar3 << 0x20) + 0x100000000;
    uVar7 = lVar3 * 8;
    do {
      if (uVar7 == 0) goto LAB_006006ef;
      lVar6 = lVar6 + -0x100000000;
      uVar1 = uVar7 - 8;
      lVar5 = uVar7 - 8;
      uVar7 = uVar1;
    } while (*(QGraphicsItem **)((long)ppQVar4 + lVar5) != item);
    if ((int)(~uVar1 >> 3) != 0) {
      if (ppQVar4[lVar3 + -1] != item) {
        ungrabKeyboard(this,*(QGraphicsItem **)((long)ppQVar4 + (lVar6 >> 0x1d)),itemIsDying);
      }
      if (itemIsDying) {
        QList<QGraphicsItem_*>::end(&this->keyboardGrabberItems);
        pqVar2 = &(this->keyboardGrabberItems).d.size;
        *pqVar2 = *pqVar2 + -1;
      }
      else {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        QEvent::QEvent((QEvent *)&local_48,UngrabKeyboard);
        sendEvent(this,item,(QEvent *)&local_48);
        QEvent::~QEvent((QEvent *)&local_48);
        QList<QGraphicsItem_*>::end(&this->keyboardGrabberItems);
        lVar3 = (this->keyboardGrabberItems).d.size;
        lVar6 = lVar3 + -1;
        (this->keyboardGrabberItems).d.size = lVar6;
        if (lVar6 != 0) {
          item_00 = (this->keyboardGrabberItems).d.ptr[lVar3 + -2];
          local_48 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
          QEvent::QEvent((QEvent *)&local_48,GrabKeyboard);
          sendEvent(this,item_00,(QEvent *)&local_48);
          QEvent::~QEvent((QEvent *)&local_48);
        }
      }
      goto LAB_006006f4;
    }
  }
LAB_006006ef:
  ungrabKeyboard();
LAB_006006f4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::ungrabKeyboard(QGraphicsItem *item, bool itemIsDying)
{
    int index = keyboardGrabberItems.lastIndexOf(item);
    if (index == -1) {
        qWarning("QGraphicsItem::ungrabKeyboard: not a keyboard grabber");
        return;
    }
    if (item != keyboardGrabberItems.constLast()) {
        // Recursively ungrab the topmost keyboard grabber until we reach this
        // item to ensure state consistency.
        ungrabKeyboard(keyboardGrabberItems.at(index + 1), itemIsDying);
    }

    // Send notification about keyboard ungrab.
    if (!itemIsDying) {
        QEvent event(QEvent::UngrabKeyboard);
        sendEvent(item, &event);
    }

    // Remove the item from the list of grabbers.
    keyboardGrabberItems.takeLast();

    // Send notification about mouse regrab.
    if (!itemIsDying && !keyboardGrabberItems.isEmpty()) {
        QGraphicsItem *last = keyboardGrabberItems.constLast();
        QEvent event(QEvent::GrabKeyboard);
        sendEvent(last, &event);
    }
}